

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynlink.c
# Opt level: O1

dynlink dynlink_load_absolute(dynlink_path path,dynlink_flags flags)

{
  dynlink handle;
  size_t sVar1;
  dynlink_impl pvVar2;
  
  handle = (dynlink)malloc(0x2010);
  if (handle != (dynlink)0x0) {
    sVar1 = strnlen(path,0x1000);
    strncpy(handle->name_impl,path,sVar1 + 1);
    handle->flags = flags;
    pvVar2 = dynlink_impl_load(handle);
    handle->impl = pvVar2;
    if (pvVar2 != (dynlink_impl)0x0) {
      return handle;
    }
    free(handle);
  }
  return (dynlink)0x0;
}

Assistant:

dynlink dynlink_load_absolute(dynlink_path path, dynlink_flags flags)
{
	dynlink handle = malloc(sizeof(struct dynlink_type));

	if (handle == NULL)
	{
		return NULL;
	}

	strncpy(handle->name_impl, path, strnlen(path, PORTABILITY_PATH_SIZE) + 1);

	handle->flags = flags;

	handle->impl = dynlink_impl_load(handle);

	if (handle->impl == NULL)
	{
		free(handle);
		return NULL;
	}

	return handle;
}